

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

void __thiscall Complete::Complete(Complete *this,BoolView *_x,bool *_v)

{
  undefined8 in_RDX;
  Propagator *in_RSI;
  BoolView *in_RDI;
  BoolView *in_stack_ffffffffffffffb8;
  Propagator *p;
  
  Propagator::Propagator(in_RSI);
  (in_RDI->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR__Complete_0031edf0;
  p = (Propagator *)&in_RDI[1].v;
  BoolView::BoolView((BoolView *)in_RSI,in_stack_ffffffffffffffb8);
  in_RDI[2].v = (int)in_RDX;
  in_RDI[2].s = (bool)(char)((ulong)in_RDX >> 0x20);
  *(int3 *)&in_RDI[2].field_0xd = (int3)((ulong)in_RDX >> 0x28);
  *(undefined4 *)&in_RDI->s = 0;
  BoolView::attach(in_RDI,p,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  return;
}

Assistant:

Complete(BoolView _x, bool* _v) : x(std::move(_x)), v(_v) {
		priority = 0;
		x.attach(this, 0, EVENT_F);
	}